

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_histogram.c
# Opt level: O0

_Bool hdr_record_values_atomic(hdr_histogram *h,int64_t value,int64_t count)

{
  int32_t index;
  int32_t counts_index;
  int64_t count_local;
  int64_t value_local;
  hdr_histogram *h_local;
  
  if ((value < 0) || (h->highest_trackable_value < value)) {
    h_local._7_1_ = false;
  }
  else {
    index = counts_index_for(h,value);
    if ((index < 0) || (h->counts_len <= index)) {
      h_local._7_1_ = false;
    }
    else {
      counts_inc_normalised_atomic(h,index,count);
      update_min_max_atomic(h,value);
      h_local._7_1_ = true;
    }
  }
  return h_local._7_1_;
}

Assistant:

bool hdr_record_values_atomic(struct hdr_histogram* h, int64_t value, int64_t count)
{
    int32_t counts_index;

    if (value < 0 || h->highest_trackable_value < value)
    {
        return false;
    }

    counts_index = counts_index_for(h, value);

    if (counts_index < 0 || h->counts_len <= counts_index)
    {
        return false;
    }

    counts_inc_normalised_atomic(h, counts_index, count);
    update_min_max_atomic(h, value);

    return true;
}